

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O3

bool __thiscall spvtools::opt::LoopPeelingPass::ProcessFunction(LoopPeelingPass *this,Function *f)

{
  Loop *loop;
  bool bVar1;
  Loop *l;
  LoopDescriptor *pLVar2;
  long lVar3;
  byte bVar4;
  pointer ppLVar5;
  pair<bool,_spvtools::opt::Loop_*> pVar6;
  vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> to_process_loop;
  iterator __end2;
  ScalarEvolutionAnalysis scev_analysis;
  LoopUtils local_178;
  vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> local_158;
  pointer local_138;
  undefined1 local_130 [16];
  __node_base _Stack_120;
  size_type local_118;
  _Prime_rehash_policy _Stack_110;
  undefined1 auStack_100 [40];
  undefined1 local_d8 [8];
  __uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_> local_d0;
  _Any_data _Stack_c8;
  _Base_ptr p_Stack_b8;
  _Base_ptr local_b0;
  __uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  _Stack_a8;
  __uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
  local_a0;
  _Hashtable<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>,_std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>,_std::allocator<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>_>,_std::__detail::_Identity,_spvtools::opt::ScalarEvolutionAnalysis::NodePointersEquality,_spvtools::opt::SENodeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  _Stack_98;
  _Rb_tree<const_spvtools::opt::Loop_*,_std::pair<const_spvtools::opt::Loop_*const,_const_spvtools::opt::Loop_*>,_std::_Select1st<std::pair<const_spvtools::opt::Loop_*const,_const_spvtools::opt::Loop_*>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_const_spvtools::opt::Loop_*>_>_>
  local_60;
  
  pLVar2 = IRContext::GetLoopDescriptor((this->super_Pass).context_,f);
  local_158.super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::reserve
            (&local_158,
             (long)(pLVar2->loops_).
                   super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pLVar2->loops_).
                   super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_d0._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>.
  super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl =
       (tuple<spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>)
       (_Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>)0x0;
  _Stack_c8._M_unused._M_object = (void *)0x0;
  _Stack_c8._8_8_ = (_Link_type)0x0;
  p_Stack_b8 = (_Base_ptr)0x0;
  local_b0 = (_Base_ptr)0x0;
  _Stack_a8._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl =
       (tuple<spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
        )(_Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
          )0x0;
  local_a0._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>._M_head_impl =
       (tuple<spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
        )(_Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
          )0x0;
  _Stack_98._M_buckets = (__buckets_ptr)0x0;
  _Stack_98._M_bucket_count = 0;
  _Stack_98._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d8 = (undefined1  [8])&pLVar2->placeholder_top_loop_;
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::_M_initialize_map((_Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                       *)&local_d0,0);
  if ((local_d8 != (undefined1  [8])0x0) &&
     (lVar3 = *(long *)&(((MessageConsumer *)((long)local_d8 + 0x38))->super__Function_base).
                        _M_functor,
     lVar3 != *(long *)((long)&(((MessageConsumer *)((long)local_d8 + 0x38))->super__Function_base).
                               _M_functor + 8))) {
    do {
      local_130._8_8_ = lVar3 + 8;
      local_130._0_8_ = local_d8;
      std::
      deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>
      ::
      emplace_back<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>
                ((deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>
                  *)&local_d0,
                 (pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>
                  *)local_130);
      local_d8 = (undefined1  [8])
                 **(long **)&(((MessageConsumer *)((long)local_d8 + 0x38))->super__Function_base).
                             _M_functor;
      lVar3 = *(long *)&(((IRContext *)local_d8)->consumer_).super__Function_base._M_functor;
    } while (lVar3 != *(long *)((long)&(((IRContext *)local_d8)->consumer_).super__Function_base.
                                       _M_functor + 8));
  }
  local_130._8_8_ = (Loop **)0x0;
  _Stack_120._M_nxt = (_Hash_node_base *)0x0;
  local_118 = 0;
  _Stack_110._M_max_load_factor = 0.0;
  _Stack_110._4_4_ = 0;
  _Stack_110._M_next_resize = 0;
  auStack_100._0_8_ = (spv_context)0x0;
  auStack_100._8_8_ = 0;
  auStack_100._16_8_ = (spv_operand_table)0x0;
  auStack_100._24_8_ = (spv_opcode_table)0x0;
  auStack_100._32_8_ = (spv_ext_inst_table)0x0;
  local_130._0_8_ = &pLVar2->placeholder_top_loop_;
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::_M_initialize_map((_Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                       *)(local_130 + 8),0);
  if (local_d8 != (undefined1  [8])local_130._0_8_) {
    do {
      local_178.context_ = (IRContext *)local_d8;
      std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>::
      emplace_back<spvtools::opt::Loop*>
                ((vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>> *)&local_158,
                 (Loop **)&local_178);
      PostOrderTreeDFIterator<spvtools::opt::Loop>::operator++
                ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)local_d8);
    } while (local_d8 != (undefined1  [8])local_130._0_8_);
  }
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                  *)(local_130 + 8));
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                  *)&local_d0);
  ScalarEvolutionAnalysis::ScalarEvolutionAnalysis
            ((ScalarEvolutionAnalysis *)local_d8,(this->super_Pass).context_);
  local_138 = local_158.
              super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (local_158.super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_158.super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    bVar4 = 0;
  }
  else {
    bVar4 = 0;
    ppLVar5 = local_158.
              super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      loop = *ppLVar5;
      local_130._8_8_ = (Loop **)0x1;
      _Stack_120._M_nxt = (_Hash_node_base *)0x0;
      local_118 = 0;
      _Stack_110._M_max_load_factor = 1.0;
      _Stack_110._M_next_resize = 0;
      auStack_100._0_8_ = (spv_context)0x0;
      local_130._0_8_ = (IRContext *)auStack_100;
      CodeMetrics::Analyze((CodeMetrics *)local_130,loop);
      bVar1 = Loop::IsLCSSA(loop);
      if (!bVar1) {
        local_178.context_ = (this->super_Pass).context_;
        local_178.loop_desc_ =
             IRContext::GetLoopDescriptor(local_178.context_,loop->loop_header_->function_);
        local_178.function_ = loop->loop_header_->function_;
        local_178.loop_ = loop;
        LoopUtils::MakeLoopClosedSSA(&local_178);
      }
      pVar6 = ProcessLoop(this,loop,(CodeMetrics *)local_130);
      bVar4 = pVar6.first | bVar4;
      if (pVar6.second != (Loop *)0x0) {
        bVar1 = Loop::IsLCSSA(loop);
        if (!bVar1) {
          local_178.context_ = (this->super_Pass).context_;
          local_178.loop_desc_ =
               IRContext::GetLoopDescriptor(local_178.context_,loop->loop_header_->function_);
          local_178.function_ = loop->loop_header_->function_;
          local_178.loop_ = loop;
          LoopUtils::MakeLoopClosedSSA(&local_178);
        }
        pVar6 = ProcessLoop(this,loop,(CodeMetrics *)local_130);
        bVar4 = bVar4 | pVar6.first;
      }
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_130);
      ppLVar5 = ppLVar5 + 1;
    } while (ppLVar5 != local_138);
  }
  std::
  _Rb_tree<const_spvtools::opt::Loop_*,_std::pair<const_spvtools::opt::Loop_*const,_const_spvtools::opt::Loop_*>,_std::_Select1st<std::pair<const_spvtools::opt::Loop_*const,_const_spvtools::opt::Loop_*>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_const_spvtools::opt::Loop_*>_>_>
  ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Hashtable<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>,_std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>,_std::allocator<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>_>,_std::__detail::_Identity,_spvtools::opt::ScalarEvolutionAnalysis::NodePointersEquality,_spvtools::opt::SENodeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&_Stack_98);
  std::
  _Rb_tree<const_spvtools::opt::Instruction_*,_std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>,_std::_Select1st<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
  ::_M_erase((_Rb_tree<const_spvtools::opt::Instruction_*,_std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>,_std::_Select1st<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
              *)&local_d0,(_Link_type)_Stack_c8._8_8_);
  if (local_158.super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.
                    super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.
                          super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.
                          super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool LoopPeelingPass::ProcessFunction(Function* f) {
  bool modified = false;
  LoopDescriptor& loop_descriptor = *context()->GetLoopDescriptor(f);

  std::vector<Loop*> to_process_loop;
  to_process_loop.reserve(loop_descriptor.NumLoops());
  for (Loop& l : loop_descriptor) {
    to_process_loop.push_back(&l);
  }

  ScalarEvolutionAnalysis scev_analysis(context());

  for (Loop* loop : to_process_loop) {
    CodeMetrics loop_size;
    loop_size.Analyze(*loop);

    auto try_peel = [&loop_size, &modified, this](Loop* loop_to_peel) -> Loop* {
      if (!loop_to_peel->IsLCSSA()) {
        LoopUtils(context(), loop_to_peel).MakeLoopClosedSSA();
      }

      bool peeled_loop;
      Loop* still_peelable_loop;
      std::tie(peeled_loop, still_peelable_loop) =
          ProcessLoop(loop_to_peel, &loop_size);

      if (peeled_loop) {
        modified = true;
      }

      return still_peelable_loop;
    };

    Loop* still_peelable_loop = try_peel(loop);
    // The pass is working out the maximum factor by which a loop can be peeled.
    // If the loop can potentially be peeled again, then there is only one
    // possible direction, so only one call is still needed.
    if (still_peelable_loop) {
      try_peel(loop);
    }
  }

  return modified;
}